

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O0

Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>_> * __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
AddFromCleared<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
          (RepeatedPtrFieldBase *this)

{
  int iVar1;
  int iVar2;
  void **ppvVar3;
  RepeatedPtrFieldBase *this_local;
  
  iVar2 = this->current_size_;
  iVar1 = allocated_size(this);
  if (iVar2 < iVar1) {
    iVar2 = ExchangeCurrentSize(this,this->current_size_ + 1);
    ppvVar3 = element_at(this,iVar2);
    this_local = (RepeatedPtrFieldBase *)
                 cast<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
                           (*ppvVar3);
  }
  else {
    this_local = (RepeatedPtrFieldBase *)0x0;
  }
  return (Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>_> *)
         this_local;
}

Assistant:

Value<TypeHandler>* AddFromCleared() {
    if (current_size_ < allocated_size()) {
      return cast<TypeHandler>(
          element_at(ExchangeCurrentSize(current_size_ + 1)));
    } else {
      return nullptr;
    }
  }